

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98d.c
# Opt level: O3

int main(int ac,char **av)

{
  int iVar1;
  FILE *__stream;
  size_t __size;
  uint8_t *__ptr;
  ulong uVar2;
  s98header *h;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  s98context context;
  s98context local_98;
  
  if (ac == 2) {
    __stream = fopen(av[1],"rb");
    if (__stream == (FILE *)0x0) {
      perror(av[1]);
      iVar1 = -1;
    }
    else {
      local_98.ts.tv_nsec = 0;
      local_98.sync_count = 0;
      local_98.tag_or_title = (char *)0x0;
      local_98.ts.tv_sec = 0;
      local_98._32_8_ = 0;
      local_98.devices = (s98deviceinfo *)0x0;
      local_98.header.offset_to_tag = 0;
      local_98.header.offset_to_dump = 0;
      local_98.header.offset_to_loop = 0;
      local_98.header.offset_to_compressed_data = 0;
      local_98.header.version = 0;
      local_98.header.timer_numerator = 0;
      local_98.header.timer_denominator = 0;
      local_98.header.compression = 0;
      fseek(__stream,0,2);
      __size = ftell(__stream);
      local_98.s98_size = __size;
      __ptr = (uint8_t *)malloc(__size);
      local_98.s98_buffer = __ptr;
      rewind(__stream);
      fread(__ptr,1,__size,__stream);
      local_98.p = __ptr;
      fclose(__stream);
      iVar1 = read_header(&local_98);
      if (iVar1 == 0) {
        read_devices(&local_98);
        printf("; S98 File: %s\n",av[1]);
        printf("; Offset to tag: 0x%08x (0 if none)\n",local_98.header._16_8_ & 0xffffffff);
        printf("; Dump start: 0x%08x\n",(ulong)local_98.header._16_8_ >> 0x20);
        printf("; Loop start: 0x%08x (0 if non-looped)\n",local_98.header._24_8_ & 0xffffffff);
        printf("#version %d\n",local_98.header._0_8_ & 0xffffffff);
        printf("#timer %d/%d\n",(ulong)local_98.header._0_8_ >> 0x20,
               local_98.header._8_8_ & 0xffffffff);
        read_tag(&local_98);
        putchar(10);
        if (local_98.header.device_count != 0) {
          lVar5 = 8;
          uVar4 = 0;
          do {
            uVar2 = (ulong)*(uint *)((long)local_98.devices + lVar5 + -8);
            if (uVar2 < 0xc) {
              pcVar3 = device_names[uVar2];
            }
            else {
              pcVar3 = (char *)0x0;
            }
            printf("#device %s %d $%02x\n",pcVar3,
                   (ulong)*(uint *)((long)local_98.devices + lVar5 + -4),
                   (ulong)*(uint *)((long)&(local_98.devices)->device + lVar5));
            uVar4 = uVar4 + 1;
            lVar5 = lVar5 + 0x10;
          } while (uVar4 < (local_98._32_8_ & 0xffffffff));
        }
        putchar(10);
        s98d_dump(&local_98);
        putchar(10);
      }
      if (local_98.devices != &default_opna) {
        free(local_98.devices);
      }
      free(local_98.s98_buffer);
      iVar1 = 0;
    }
  }
  else {
    main_cold_1();
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int ac, char** av)
{
    struct s98context context;
    struct s98context* ctx = &context;
    struct s98header* h = &context.header;
    FILE* fp;

    if(ac != 2) {
        fprintf(stderr, "Usage: %s filename.s98\n", *av);
        return 1;
    }

    fp = fopen(*++av, "rb");
    if(fp == NULL) {
        perror(*av);
        return -1;
    }

    memset(ctx, 0, sizeof context);

    fseek(fp, 0, SEEK_END);
    ctx->s98_size = ftell(fp);
    ctx->s98_buffer = malloc(ctx->s98_size);

    rewind(fp);
    fread(ctx->s98_buffer, 1, ctx->s98_size, fp);
    set_offset(ctx, 0);
    fclose(fp);

    if(read_header(ctx) != 0)
        goto cleanup;
    read_devices(ctx);

    printf("; S98 File: %s\n", *av);
    printf("; Offset to tag: 0x%08x (0 if none)\n", h->offset_to_tag);
    printf("; Dump start: 0x%08x\n", h->offset_to_dump);
    printf("; Loop start: 0x%08x (0 if non-looped)\n", h->offset_to_loop);

    printf("#version %d\n", h->version);
    printf("#timer %d/%d\n", h->timer_numerator, h->timer_denominator);

    read_tag(ctx);

    putchar('\n');
    {
        int i;
        for(i = 0; i < h->device_count; i++) {
            struct s98deviceinfo* info;
            info = ctx->devices + i;

            printf("#device %s %d $%02x\n", device_name(info->device), info->clock, info->panpot);
        }
    }

    putchar('\n');

    s98d_dump(ctx);

    putchar('\n');


cleanup:
    free_context(&context);

    return 0;
}